

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
jessilib::app_parameters::app_parameters
          (app_parameters *this,int param_1,char **in_argv,char **in_envp,set_type *in_stop_args)

{
  char **in_ntarg_array;
  char **extraout_RDX;
  char **in_ntarg_array_00;
  jessilib *this_00;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_70;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_38;
  
  if (in_argv == (char **)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    this_00 = (jessilib *)0x0;
    in_ntarg_array = (char **)0x0;
  }
  else {
    ntarg_cast<char8_t,_const_char,_nullptr>(&local_70,*in_argv);
    this_00 = (jessilib *)(in_argv + 1);
    in_ntarg_array = extraout_RDX;
    if (*in_argv == (char *)0x0) {
      this_00 = (jessilib *)0x0;
    }
  }
  vectorize_ntargs<char8_t,char_const>(&local_38,this_00,in_ntarg_array);
  vectorize_ntargs<char8_t,char_const>(&local_50,(jessilib *)in_envp,in_ntarg_array_00);
  app_parameters(this,&local_70,&local_38,&local_50,in_stop_args);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_50);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

app_parameters::app_parameters(int, const char** in_argv, const char** in_envp, const set_type& in_stop_args)
	: app_parameters{ get_first_arg(in_argv), vectorize_ntargs(get_next_args(in_argv)), vectorize_ntargs(in_envp), in_stop_args } {
	// Empty ctor body
}